

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::Paint::renderList
          (Paint *this,vector<VDrawable_*,_std::allocator<VDrawable_*>_> *list)

{
  pointer *pppVVar1;
  iterator __position;
  VDrawable *local_18;
  
  if (this->mRenderNodeUpdate == true) {
    updateRenderNode(this);
    this->mRenderNodeUpdate = false;
  }
  if (this->mContentToRender == true) {
    local_18 = &(this->mDrawable).super_VDrawable;
    __position._M_current =
         (list->super__Vector_base<VDrawable_*,_std::allocator<VDrawable_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (list->super__Vector_base<VDrawable_*,_std::allocator<VDrawable_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VDrawable*,std::allocator<VDrawable*>>::_M_realloc_insert<VDrawable*>
                ((vector<VDrawable*,std::allocator<VDrawable*>> *)list,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppVVar1 = &(list->super__Vector_base<VDrawable_*,_std::allocator<VDrawable_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
  }
  return;
}

Assistant:

void renderer::Paint::renderList(std::vector<VDrawable *> &list)
{
    if (mRenderNodeUpdate) {
        updateRenderNode();
        mRenderNodeUpdate = false;
    }

    // Q: Why we even update the final path if we don't have content
    // to render ?
    // Ans: We update the render nodes because we will loose the
    // dirty path information at end of this frame.
    // so if we return early without updating the final path.
    // in the subsequent frame when we have content to render but
    // we may not able to update our final path properly as we
    // don't know what paths got changed in between.
    if (mContentToRender) list.push_back(&mDrawable);
}